

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DExporter::NodeHelper_CloseNode(X3DExporter *this,string *pNodeName,size_t pTabLevel)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  size_t local_20;
  size_t pTabLevel_local;
  string *pNodeName_local;
  X3DExporter *this_local;
  
  local_20 = pTabLevel;
  pTabLevel_local = (size_t)pNodeName;
  pNodeName_local = (string *)this;
  IndentationStringSet(this,pTabLevel);
  XML_Write(this,&this->mIndentationString);
  std::operator+(&local_60,"</",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 pTabLevel_local);
  std::operator+(&local_40,&local_60,">\n");
  XML_Write(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void X3DExporter::NodeHelper_CloseNode(const string& pNodeName, const size_t pTabLevel)
{
	// Write indentation.
	IndentationStringSet(pTabLevel);
	XML_Write(mIndentationString);
	// Write element
	XML_Write("</" + pNodeName + ">\n");
}